

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry>::copy
          (SmallVectorBase<slang::ast::PrimitiveSymbol::TableEntry> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  char *pcVar2;
  char cVar3;
  bool bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  byte *pbVar10;
  byte *pbVar11;
  pointer pTVar12;
  byte *pbVar13;
  pointer pTVar14;
  byte *pbVar15;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar10 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar13 = pbVar10 + sVar1 * 0x18;
  if (*(byte **)(dst + 8) < pbVar13) {
    pbVar11 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x18,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_00200d3e;
    pTVar12 = this->data_;
    pTVar14 = pTVar12 + sVar1;
    pbVar13 = pbVar11 + sVar1 * 0x18;
    pbVar10 = pbVar11;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar13;
    pTVar12 = this->data_;
    pTVar14 = pTVar12 + sVar1;
    pbVar11 = pbVar10;
  }
  do {
    pbVar15 = pbVar10 + 0x18;
    cVar3 = pTVar12->output;
    bVar4 = pTVar12->isEdgeSensitive;
    uVar5 = pTVar12->field_0x13;
    uVar6 = pTVar12->field_0x14;
    uVar7 = pTVar12->field_0x15;
    uVar8 = pTVar12->field_0x16;
    uVar9 = pTVar12->field_0x17;
    pbVar10[0x10] = pTVar12->state;
    pbVar10[0x11] = cVar3;
    pbVar10[0x12] = bVar4;
    pbVar10[0x13] = uVar5;
    pbVar10[0x14] = uVar6;
    pbVar10[0x15] = uVar7;
    pbVar10[0x16] = uVar8;
    pbVar10[0x17] = uVar9;
    pcVar2 = (pTVar12->inputs)._M_str;
    *(size_t *)pbVar10 = (pTVar12->inputs)._M_len;
    *(char **)(pbVar10 + 8) = pcVar2;
    if (pTVar12 + 1 == pTVar14) break;
    pTVar12 = pTVar12 + 1;
    pbVar10 = pbVar15;
  } while (pbVar15 != pbVar13);
LAB_00200d3e:
  return (int)pbVar11;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }